

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
* toml::detail::parse_impl<toml::type_config>
            (vector<unsigned_char,_std::allocator<unsigned_char>_> *cs,string *fname,spec *s)

{
  table_format_info fmt;
  bool bVar1;
  char_type_conflict cVar2;
  char_type_conflict cVar3;
  char_type_conflict cVar4;
  reference pvVar5;
  element_type *this;
  size_type sVar6;
  location *in_RSI;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_RDI;
  context<toml::type_config> ctx;
  bool bom_found;
  char_type_conflict c2;
  char_type_conflict c1;
  char_type_conflict c0;
  location first;
  location loc;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> src;
  location loc_1;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> src_1;
  context<toml::type_config> *in_stack_00001ca0;
  location *in_stack_00001ca8;
  uint7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  location *in_stack_fffffffffffffb60;
  location *plVar7;
  undefined6 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *this_00;
  region_type *in_stack_fffffffffffffbd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbe0;
  table_type *in_stack_fffffffffffffbe8;
  basic_value<toml::type_config> *in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf8 [12];
  undefined1 in_stack_fffffffffffffc04;
  undefined1 in_stack_fffffffffffffc05;
  undefined1 in_stack_fffffffffffffc06;
  undefined1 in_stack_fffffffffffffc07;
  basic_value<toml::type_config> *in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  undefined1 local_390 [16];
  undefined1 local_380 [208];
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined1 local_298;
  undefined1 uStack_297;
  undefined4 uStack_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  
  this_00 = in_RDI;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffb60);
  if (bVar1) {
    std::
    make_shared<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb78);
    std::shared_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>const>::
    shared_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ((shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffb50,
               (shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::string(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    location::location(in_stack_fffffffffffffb60,
                       (source_ptr *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                       (string *)in_stack_fffffffffffffb50);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb50);
    std::shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~shared_ptr
              ((shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               0x72166f);
    local_268 = 0;
    uStack_260 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_288 = 0;
    uStack_280 = 0;
    local_258 = 0;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                     *)0x7216a8);
    local_298 = 0;
    uStack_297 = 0;
    uStack_294 = 0;
    local_290 = 0;
    uStack_28c = 0;
    local_380._200_8_ = (pointer)0x0;
    uStack_2b0 = 0;
    local_2a8 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x7216ff);
    region::region((region *)this_00,in_RSI);
    fmt.closing_indent._0_1_ = in_stack_fffffffffffffc04;
    fmt.fmt = in_stack_fffffffffffffbf8[0];
    fmt.indent_type = in_stack_fffffffffffffbf8[1];
    fmt._2_2_ = in_stack_fffffffffffffbf8._2_2_;
    fmt.body_indent = in_stack_fffffffffffffbf8._4_4_;
    fmt.name_indent = in_stack_fffffffffffffbf8._8_4_;
    fmt.closing_indent._1_1_ = in_stack_fffffffffffffc05;
    fmt.closing_indent._2_1_ = in_stack_fffffffffffffc06;
    fmt.closing_indent._3_1_ = in_stack_fffffffffffffc07;
    basic_value<toml::type_config>::basic_value
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,fmt,in_stack_fffffffffffffbe0,
               in_stack_fffffffffffffbd8);
    ok<toml::basic_value<toml::type_config>>(in_stack_fffffffffffffc38);
    result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
    ::result(in_stack_fffffffffffffb50,
             (success_type *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    success<toml::basic_value<toml::type_config>_>::~success
              ((success<toml::basic_value<toml::type_config>_> *)0x721785);
    basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)in_stack_fffffffffffffb50);
    region::~region((region *)in_stack_fffffffffffffb50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb60);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                      *)0x7217b9);
    location::~location((location *)in_stack_fffffffffffffb50);
    std::shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~shared_ptr
              ((shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x7217d3);
  }
  else {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffffb50);
    if (*pvVar5 != '\n') {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          in_stack_fffffffffffffb50);
      if (*pvVar5 != '\r') {
        local_380[0x5f] = 10;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb50,
                   (value_type_conflict2 *)
                   CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      }
    }
    plVar7 = (location *)(local_380 + 0x48);
    std::
    make_shared<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb78);
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390;
    std::shared_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>const>::
    shared_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ((shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffb50,
               (shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::string(&local_3b0,__str);
    location::location(in_stack_fffffffffffffb60,
                       (source_ptr *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                       (string *)in_stack_fffffffffffffb50);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb50);
    std::shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~shared_ptr
              ((shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               0x721977);
    location::source((location *)local_380);
    this = std::
           __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x72198c);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this);
    if (2 < sVar6) {
      location::location(plVar7,(location *)
                                CONCAT17(in_stack_fffffffffffffb6f,
                                         CONCAT16(in_stack_fffffffffffffb6e,
                                                  in_stack_fffffffffffffb68)));
      cVar2 = location::current((location *)
                                CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      plVar7 = (location *)local_380;
      location::advance(plVar7,CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
      cVar3 = location::current((location *)
                                CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      in_stack_fffffffffffffb50 =
           (result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
            *)local_380;
      location::advance(plVar7,CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
      cVar4 = location::current((location *)
                                CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      location::advance(plVar7,CONCAT17(cVar4,in_stack_fffffffffffffb58));
      in_stack_fffffffffffffb4f = false;
      if ((cVar2 == 0xef) && (in_stack_fffffffffffffb4f = false, cVar3 == 0xbb)) {
        in_stack_fffffffffffffb4f = cVar4 == 0xbf;
      }
      if ((bool)in_stack_fffffffffffffb4f == false) {
        location::operator=((location *)in_stack_fffffffffffffb50,
                            (location *)(ulong)in_stack_fffffffffffffb48);
      }
      location::~location((location *)in_stack_fffffffffffffb50);
    }
    context<toml::type_config>::context
              ((context<toml::type_config> *)in_stack_fffffffffffffb50,
               (spec *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    parse_file<toml::type_config>(in_stack_00001ca8,in_stack_00001ca0);
    context<toml::type_config>::~context((context<toml::type_config> *)0x721b7c);
    location::~location((location *)in_stack_fffffffffffffb50);
    std::shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~shared_ptr
              ((shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x721b96);
  }
  return in_RDI;
}

Assistant:

result<basic_value<TC>, std::vector<error_info>>
parse_impl(std::vector<location::char_type> cs, std::string fname, const spec& s)
{
    using value_type = basic_value<TC>;
    using table_type = typename value_type::table_type;

    // an empty file is a valid toml file.
    if(cs.empty())
    {
        auto src = std::make_shared<std::vector<location::char_type>>(std::move(cs));
        location loc(std::move(src), std::move(fname));
        return ok(value_type(table_type(), table_format_info{}, std::vector<std::string>{}, region(loc)));
    }

    // to simplify parser, add newline at the end if there is no LF.
    // But, if it has raw CR, the file is invalid (in TOML, CR is not a valid
    // newline char). if it ends with CR, do not add LF and report it.
    if(cs.back() != '\n' && cs.back() != '\r')
    {
        cs.push_back('\n');
    }

    auto src = std::make_shared<std::vector<location::char_type>>(std::move(cs));

    location loc(std::move(src), std::move(fname));

    // skip BOM if found
    if(loc.source()->size() >= 3)
    {
        auto first = loc;

        const auto c0 = loc.current(); loc.advance();
        const auto c1 = loc.current(); loc.advance();
        const auto c2 = loc.current(); loc.advance();

        const auto bom_found = (c0 == 0xEF) && (c1 == 0xBB) && (c2 == 0xBF);
        if( ! bom_found)
        {
            loc = first;
        }
    }

    context<TC> ctx(s);

    return parse_file(loc, ctx);
}